

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

float64 vector_pdf_entropy(float32 *p,int32 len)

{
  ulong uVar1;
  ulong uVar2;
  double __x;
  double dVar3;
  double dVar4;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)len;
  if (len < 1) {
    uVar1 = uVar2;
  }
  dVar4 = 0.0;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    if (0.0 < (float)p[uVar2]) {
      __x = (double)(float)p[uVar2];
      dVar3 = log(__x);
      dVar4 = dVar4 - dVar3 * __x;
    }
  }
  return (float64)(dVar4 / 0.6931471805599453);
}

Assistant:

float64
vector_pdf_entropy(float32 * p, int32 len)
{
    float64 sum;
    int32 i;

    sum = 0.0;
    for (i = 0; i < len; i++) {
        if (p[i] > 0.0)
            sum -= p[i] * log(p[i]);
    }
    sum /= log(2.0);

    return sum;
}